

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nls.c
# Opt level: O2

int lmdif(custom_funcmult *funcmult,double *x,int M,int N,double *fvec,double *fjac,int ldfjac,
         int maxfev,double *diag,int mode,double factor,int nprint,double eps,double epsfcn,
         double ftol,double gtol,double xtol,int *nfev,int *njev,int *ipvt,double *qtf)

{
  size_t __size;
  bool bVar1;
  bool bVar2;
  int iVar3;
  double *rdiag;
  double *x_00;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  int N_00;
  long lVar8;
  double *pdVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double *in_stack_fffffffffffffe68;
  double local_b8;
  double local_a8;
  double local_98;
  double par;
  ulong local_88;
  double *local_80;
  double *local_78;
  double *local_70;
  int local_64;
  double local_60;
  ulong local_58;
  double local_50;
  double *local_48;
  double *local_40;
  uint local_34;
  
  uVar14 = (ulong)(uint)N;
  local_40 = (double *)(long)N;
  __size = (long)local_40 * 8;
  par = (double)funcmult;
  local_80 = fjac;
  local_70 = fvec;
  local_48 = x;
  rdiag = (double *)malloc(__size);
  local_78 = (double *)malloc(__size);
  x_00 = (double *)malloc(__size);
  pdVar4 = (double *)malloc((long)M << 3);
  pdVar6 = local_70;
  *nfev = 0;
  *njev = 0;
  uVar12 = 0;
  uVar13 = 0;
  if (((((0 < (int)local_40) && (N <= M)) && (uVar13 = uVar12, M <= ldfjac)) &&
      ((0.0 <= ftol && (0.0 <= xtol)))) && ((0.0 < factor && ((0 < maxfev && (0.0 <= gtol)))))) {
    if (mode == 2) {
      uVar5 = 0;
      do {
        if (uVar14 == uVar5) goto LAB_001413d1;
        pdVar9 = diag + uVar5;
        uVar5 = uVar5 + 1;
      } while (0.0 < *pdVar9);
      uVar13 = 0;
    }
    else {
LAB_001413d1:
      local_58 = uVar14;
      local_40 = pdVar4;
      local_34 = M;
      (**(code **)par)(local_48,M,uVar14,local_70,*(undefined8 *)((long)par + 8));
      *nfev = 1;
      local_b8 = enorm(pdVar6,M);
      local_98 = 0.0;
      iVar3 = (int)local_58;
      local_88 = (ulong)(uint)M;
      local_64 = 1;
      while( true ) {
        N_00 = (int)local_58;
        iVar10 = N_00;
        fdjac2((custom_funcmult *)par,local_48,M,N_00,pdVar6,local_80,(int)in_stack_fffffffffffffe68
               ,epsfcn,eps);
        *njev = *njev + N_00;
        qrfac(local_80,local_34,N_00,iVar10,1,ipvt,(int)in_stack_fffffffffffffe68,rdiag,local_78,eps
             );
        uVar13 = local_34;
        dVar15 = local_60;
        if (local_64 == 1) {
          if (mode != 2) {
            for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
              uVar7 = -(ulong)(local_78[uVar5] == 0.0);
              diag[uVar5] = (double)(uVar7 & 0x3ff0000000000000 | ~uVar7 & (ulong)local_78[uVar5]);
            }
          }
          for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
            x_00[uVar5] = diag[uVar5] * local_48[uVar5];
          }
          dVar15 = enorm(x_00,(int)local_58);
          local_50 = dVar15 * factor;
          if ((local_50 == 0.0) && (!NAN(local_50))) {
            local_50 = factor;
          }
        }
        for (uVar5 = 0; local_88 != uVar5; uVar5 = uVar5 + 1) {
          local_40[uVar5] = local_70[uVar5];
        }
        lVar8 = 0;
        uVar5 = 0;
        pdVar6 = local_80;
        pdVar4 = local_40;
        while( true ) {
          uVar7 = uVar5 & 0xffffffff;
          if ((int)uVar5 < (int)uVar13) {
            uVar7 = (ulong)uVar13;
          }
          if (uVar5 == uVar14) break;
          iVar10 = (iVar3 + 1) * (int)uVar5;
          dVar16 = local_80[iVar10];
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            dVar20 = 0.0;
            pdVar9 = pdVar6;
            for (lVar11 = 0; uVar7 + lVar8 != lVar11; lVar11 = lVar11 + 1) {
              dVar20 = dVar20 + *pdVar9 * pdVar4[lVar11];
              pdVar9 = pdVar9 + uVar14;
            }
            local_a8 = -dVar20 / dVar16;
            pdVar9 = pdVar6;
            for (lVar11 = 0; uVar7 + lVar8 != lVar11; lVar11 = lVar11 + 1) {
              pdVar4[lVar11] = *pdVar9 * local_a8 + pdVar4[lVar11];
              pdVar9 = pdVar9 + uVar14;
            }
          }
          local_80[iVar10] = rdiag[uVar5];
          qtf[uVar5] = local_40[uVar5];
          uVar5 = uVar5 + 1;
          lVar8 = lVar8 + -1;
          pdVar4 = pdVar4 + 1;
          pdVar6 = pdVar6 + uVar14 + 1;
        }
        dVar16 = 0.0;
        local_60 = dVar15;
        if ((local_b8 != 0.0) || (NAN(local_b8))) {
          dVar16 = 0.0;
          lVar8 = 1;
          pdVar6 = local_80;
          for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
            dVar20 = local_78[ipvt[uVar5]];
            if ((dVar20 != 0.0) || (NAN(dVar20))) {
              dVar15 = 0.0;
              pdVar4 = pdVar6;
              for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
                dVar15 = dVar15 + (qtf[lVar11] / local_b8) * *pdVar4;
                pdVar4 = pdVar4 + uVar14;
              }
              dVar16 = pmax(dVar16,ABS(dVar15 / dVar20));
              dVar15 = local_60;
            }
            lVar8 = lVar8 + 1;
            pdVar6 = pdVar6 + 1;
          }
        }
        if (dVar16 <= gtol) break;
        dVar20 = local_50;
        if (mode != 2) {
          for (uVar5 = 0; dVar20 = local_50, uVar14 != uVar5; uVar5 = uVar5 + 1) {
            dVar15 = pmax(diag[uVar5],local_78[uVar5]);
            diag[uVar5] = dVar15;
            dVar15 = local_60;
          }
        }
        dVar21 = 0.0;
        while (pdVar4 = local_78, pdVar6 = local_70, M = local_34, local_60 = dVar15,
              local_50 = dVar20, dVar21 < 0.0001) {
          in_stack_fffffffffffffe68 = &local_98;
          lmpar(local_80,(int)local_48,(int)local_58,ipvt,diag,qtf,dVar20,in_stack_fffffffffffffe68,
                rdiag,local_78);
          for (uVar5 = 0; uVar14 != uVar5; uVar5 = uVar5 + 1) {
            dVar15 = rdiag[uVar5];
            dVar20 = -dVar15;
            rdiag[uVar5] = dVar20;
            pdVar4[uVar5] = local_48[uVar5] - dVar15;
            x_00[uVar5] = diag[uVar5] * dVar20;
          }
          dVar15 = enorm(x_00,(int)local_58);
          if (local_64 == 1) {
            local_50 = pmin(local_50,dVar15);
          }
          (**(code **)par)(pdVar4,local_34,local_58,local_40,*(undefined8 *)((long)par + 8));
          *nfev = *nfev + 1;
          dVar17 = enorm(local_40,local_34);
          dVar19 = 1.0 - (dVar17 / local_b8) * (dVar17 / local_b8);
          lVar8 = 1;
          pdVar6 = local_80;
          for (uVar5 = 0; uVar5 != uVar14; uVar5 = uVar5 + 1) {
            x_00[uVar5] = 0.0;
            local_a8 = rdiag[ipvt[uVar5]];
            pdVar9 = pdVar6;
            for (lVar11 = 0; lVar8 != lVar11; lVar11 = lVar11 + 1) {
              x_00[lVar11] = *pdVar9 * local_a8 + x_00[lVar11];
              pdVar9 = pdVar9 + uVar14;
            }
            lVar8 = lVar8 + 1;
            pdVar6 = pdVar6 + 1;
          }
          dVar20 = enorm(x_00,(int)local_58);
          dVar22 = local_98;
          if (local_98 < 0.0) {
            dVar21 = sqrt(local_98);
          }
          else {
            dVar21 = SQRT(local_98);
          }
          uVar5 = -(ulong)(dVar17 * 0.1 < local_b8);
          dVar23 = (double)(~uVar5 & 0xbff0000000000000 | uVar5 & (ulong)dVar19);
          dVar18 = (dVar21 * dVar15) / local_b8;
          dVar18 = dVar18 * dVar18;
          dVar20 = (dVar20 / local_b8) * (dVar20 / local_b8);
          dVar24 = dVar18 + dVar18 + dVar20;
          dVar21 = (double)(-(ulong)(dVar24 != 0.0) & (ulong)(dVar23 / dVar24));
          if (dVar21 <= 0.25) {
            dVar20 = dVar20 + dVar18;
            dVar20 = (double)(~-(ulong)(dVar23 < 0.0) &
                              (~-(ulong)(dVar23 < 0.0) & 0x3fe0000000000000 |
                              (ulong)local_a8 & -(ulong)(dVar23 < 0.0)) |
                             (ulong)((dVar20 * -0.5) / (dVar23 * 0.5 - dVar20)) &
                             -(ulong)(dVar23 < 0.0));
            local_a8 = 0.1;
            if (dVar17 * 0.1 < local_b8 && 0.1 <= dVar20) {
              local_a8 = dVar20;
            }
            dVar15 = pmin(local_50,dVar15 / 0.1);
            local_98 = dVar22 / local_a8;
            dVar20 = dVar15 * local_a8;
          }
          else if (((dVar22 == 0.0) && (!NAN(dVar22))) || (dVar20 = local_50, 0.75 <= dVar21)) {
            local_98 = dVar22 * 0.5;
            dVar20 = dVar15 + dVar15;
          }
          dVar15 = local_60;
          if (0.0001 <= dVar21) {
            for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
              dVar15 = pdVar4[uVar7];
              local_48[uVar7] = dVar15;
              pdVar4[uVar7] = dVar15 * diag[uVar7];
            }
            for (uVar7 = 0; local_88 != uVar7; uVar7 = uVar7 + 1) {
              local_70[uVar7] = local_40[uVar7];
            }
            local_50 = dVar20;
            dVar15 = enorm(pdVar4,(int)local_58);
            local_64 = local_64 + 1;
            dVar20 = local_50;
            local_b8 = dVar17;
          }
          dVar22 = (double)(~uVar5 & 0x3ff0000000000000 | (ulong)ABS(dVar19) & uVar5);
          bVar1 = ftol < dVar22;
          bVar2 = ftol < dVar24;
          dVar17 = dVar21 * 0.5;
          dVar19 = dVar15 * xtol;
          if (((!bVar2 && !bVar1) && (dVar17 <= 1.0)) && (dVar20 <= dVar19)) {
            uVar13 = 3;
            goto LAB_00141d9a;
          }
          if (((!bVar2 && !bVar1) && 1.0 >= dVar17) || (dVar20 <= dVar19)) {
            uVar13 = 2;
            if (dVar19 < dVar20) {
              uVar13 = (byte)~((bVar2 || bVar1) || 1.0 < dVar17) & 1;
            }
            goto LAB_00141d9a;
          }
          uVar12 = (uint)(maxfev <= *nfev) * 5;
          uVar13 = 6;
          if (1.0 < dVar17) {
            uVar13 = uVar12;
          }
          if (eps < dVar24) {
            uVar13 = uVar12;
          }
          if (eps < dVar22) {
            uVar13 = uVar12;
          }
          if (dVar20 <= dVar15 * eps) {
            uVar13 = 7;
          }
          if (dVar16 <= eps) {
            uVar13 = 8;
          }
          if (uVar13 != 0) goto LAB_00141d9a;
        }
      }
      uVar13 = 4;
LAB_00141d9a:
      free(rdiag);
      free(local_78);
      free(x_00);
      free(local_40);
    }
  }
  return uVar13;
}

Assistant:

int lmdif(custom_funcmult *funcmult, double *x, int M, int N, double *fvec, double *fjac, int ldfjac,
		int maxfev,double *diag,int mode,double factor,int nprint,double eps,double epsfcn,double ftol,double gtol,
		double xtol,int *nfev,int *njev,int *ipvt, double *qtf) {
	int info;
	int i,j,l,iter;
    double actred,delta,dirder,epsmch,fnorm,fnorm1,gnorm,one,par,pnorm,prered,p1,p5,p25,p75,p0001,ratio,
    sum,temp,temp1,temp2,xnorm,zero;
    double *wa1,*wa2,*wa3,*wa4;

    /*
     * 	*   This routine is a C translation of Fortran Code by
    *     argonne national laboratory. minpack project. march 1980.
     	  burton s. garbow, kenneth e. hillstrom, jorge j. more
     *  M is a positive integer input variable set to the number
c         of functions.
c
c       N is a positive integer input variable set to the number
c         of variables. N must not exceed M.
c
c       x is an array of length N. on input x must contain
c         an initial estimate of the solution vector. on output x
c         contains the final estimate of the solution vector.
c
c       fvec is an output array of length M which contains
c         the functions evaluated at the output x.
c
c       fjac is an output M by N array. the upper N by N submatrix
c         of fjac contains an upper triangular matrix r with
c         diagonal elements of nonincreasing magnitude such that
c
c                t     t           t
c               p *(jac *jac)*p = r *r,
c
c         where p is a permutation matrix and jac is the final
c         calculated jacobian. column j of p is column ipvt(j)
c         (see below) of the identity matrix. the lower trapezoidal
c         part of fjac contains information generated during
c         the computation of r.
c
c       ldfjac is a positive integer input variable not less than M
c         which specifies the leading dimension of the array fjac.
c
c       ftol is a nonnegative input variable. termination
c         occurs when both the actual and predicted relative
c         reductions in the sum of squares are at most ftol.
c         therefore, ftol measures the relative error desired
c         in the sum of squares.
c
c       xtol is a nonnegative input variable. termination
c         occurs when the relative error between two consecutive
c         iterates is at most xtol. therefore, xtol measures the
c         relative error desired in the approximate solution.
c
c       gtol is a nonnegative input variable. termination
c         occurs when the cosine of the angle between fvec and
c         any column of the jacobian is at most gtol in absolute
c         value. therefore, gtol measures the orthogonality
c         desired between the function vector and the columns
c         of the jacobian.
c
c       maxfev is a positive integer input variable. termination
c         occurs when the number of calls to fcn with iflag = 1
c         has reached maxfev.
c
c       epsfcn is an input variable used in determining a suitable
c         step length for the forward-difference approximation. this
c         approximation assumes that the relative errors in the
c         functions are of the order of epsfcn. if epsfcn is less
c         than the machine precision, it is assumed that the relative
c         errors in the functions are of the order of the machine
c         precision.
c
c       diag is an array of length N. if mode = 1 (see
c         below), diag is internally set. if mode = 2, diag
c         must contain positive entries that serve as
c         multiplicative scale factors for the variables.
c
c       mode is an integer input variable. if mode = 1, the
c         variables will be scaled internally. if mode = 2,
c         the scaling is specified by the input diag. other
c         values of mode are equivalent to mode = 1.
c
c       factor is a positive input variable used in determining the
c         initial step bound. this bound is set to the product of
c         factor and the euclidean norm of diag*x if nonzero, or else
c         to factor itself. in most cases factor should lie in the
c         interval (.1,100.).100. is a generally recommended value.
c
c       nprint is an integer input variable that enables controlled
c         printing of iterates if it is positive. in this case,
c         fcn is called with iflag = 0 at the beginning of the first
c         iteration and every nprint iterations thereafter and
c         immediately prior to return, with x, fvec, and fjac
c         available for printing. fvec and fjac should not be
c         altered. if nprint is not positive, no special calls
c         of fcn with iflag = 0 are made.
c
c       info is an integer output variable. if the user has
c         terminated execution, info is set to the (negative)
c         value of iflag. see description of fcn. otherwise,
c         info is set as follows.
c
c         info = 0  improper input parameters.
c
c         info = 1  both actual and predicted relative reductions
c                   in the sum of squares are at most ftol.
c
c         info = 2  relative error between two consecutive iterates
c                   is at most xtol.
c
c         info = 3  conditions for info = 1 and info = 2 both hold.
c
c         info = 4  the cosine of the angle between fvec and any
c                   column of the jacobian is at most gtol in
c                   absolute value.
c
c         info = 5  number of calls to fcn with iflag = 1 has
c                   reached maxfev.
c
c         info = 6  ftol is too small. no further reduction in
c                   the sum of squares is possible.
c
c         info = 7  xtol is too small. no further improvement in
c                   the approximate solution x is possible.
c
c         info = 8  gtol is too small. fvec is orthogonal to the
c                   columns of the jacobian to machine precision.
c
c       nfev is an integer output variable set to the number of
c         calls to fcn with iflag = 1.
c
c       njev is an integer output variable set to the number of
c         calls to fcn with iflag = 2.
c
c       ipvt is an integer output array of length N. ipvt
c         defines a permutation matrix p such that jac*p = q*r,
c         where jac is the final calculated jacobian, q is
c         orthogonal (not stored), and r is upper triangular
c         with diagonal elements of nonincreasing magnitude.
c         column j of p is column ipvt(j) of the identity matrix.
c
c       qtf is an output array of length N which contains
c         the first n elements of the vector (q transpose)*fvec.
     */

	wa1 = (double*) malloc(sizeof(double) *N);
	wa2 = (double*) malloc(sizeof(double) *N);
	wa3 = (double*) malloc(sizeof(double) *N);
	wa4 = (double*) malloc(sizeof(double) *M);

    one = 1.0;
    zero = 0.0;
    p1 = 1.0e-1; p5 = 5.0e-1; p25 = 2.5e-1; p75 = 7.5e-1; p0001 = 1.0e-4;
    epsmch = eps;

    info = 0;
    *nfev = 0;
    *njev = 0;

    if (N <= 0 || M < N || ldfjac < M || ftol < zero || xtol < zero || gtol < zero || maxfev <= 0 || factor <= zero) {
    	return info;
    }

    if (mode == 2) {
		for(j = 0; j < N;++j) {
			if (diag[j] <= 0.0) {
				return info;
			}
		}
    }

    //     evaluate the function at the starting point
    //     and calculate its norm.

    FUNCMULT_EVAL(funcmult,x,M,N,fvec);
    *nfev= 1;
    fnorm = enorm(fvec,M);

    //     initialize levenberg-marquardt parameter and iteration counter.
    par = zero;
    iter = 1;
    ratio = zero;

    //     beginning of the outer loop.

    while(1) {
    	//        calculate the jacobian matrix.
    	ratio = zero;
    	fdjac2(funcmult,x,M,N,fvec,fjac,ldfjac,epsfcn,epsmch);
    	*njev = *njev + N;

    	//        compute the qr factorization of the jacobian.

    	qrfac(fjac,M,N,ldfjac,1,ipvt,N,wa1,wa2,eps);

    	//        on the first iteration and if mode is 1, scale according
    	//        to the norms of the columns of the initial jacobian.

    	if (iter == 1) {//80
    		if (mode != 2) {//60
    			for(j = 0;j < N;++j) {
    				diag[j] = wa2[j];
    				if (wa2[j] == zero) {
    					diag[j] = one;
    				}
    			}
    		}//60

    		//        on the first iteration, calculate the norm of the scaled x
    		//        and initialize the step bound delta.

    		for(j = 0; j < N;++j) {
    			wa3[j] = diag[j]*x[j];
    		}
            xnorm = enorm(wa3,N);
            delta = factor*xnorm;

            if (delta == zero) {
            	delta = factor;
            }

    	}//80

        //        form (q transpose)*fvec and store the first n components in
        //        qtf.

    	for(i = 0; i < M;++i) {
    		wa4[i] = fvec[i];
    	}

    	for(j = 0; j < N;++j) {//130
    		if (fjac[j*N+j] != zero) {//120
    			sum = zero;
    			for(i = j; i < M;++i) {//100
    				sum = sum + fjac[i*N+j]*wa4[i];
    			}//100
    			temp = -sum/fjac[j*N+j];
    			for(i = j; i < M;++i) {//110
    				wa4[i] = wa4[i] + fjac[i*N+j]*temp;
    			}//110
    		}//120
            fjac[j*N+j] = wa1[j];
            qtf[j] = wa4[j];
    	}//130

    	//        compute the norm of the scaled gradient.
    	gnorm = zero;

    	if (fnorm != zero) {//170
    		for(j = 0; j < N;++j) {//160
    			l = ipvt[j];
    			if (wa2[l] != zero) {//150
    				sum = zero;
    				for(i = 0; i <= j;++i) { //140
    					sum = sum + fjac[i*N+j]*(qtf[i]/fnorm);
    				}//140
    				gnorm = pmax(gnorm,fabs(sum/wa2[l]));
    			}//150
    		}//160
    	}//170

    	//        test for convergence of the gradient norm.
    	if (gnorm <= gtol) {
    		info = 4;
    	}
    	if (info != 0) {
    		break;
    	}

    	//        rescale if necessary.
    	if (mode != 2) { //190
    		for(j = 0; j < N;++j) {
    			diag[j] = pmax(diag[j],wa2[j]);
    		}
    	}//190

    	//        beginning of the inner loop.

    	while(ratio < p0001) {
    		//           determine the levenberg-marquardt parameter.
    		lmpar(fjac,ldfjac,N,ipvt,diag,qtf,delta,&par,wa1,wa2);
    		//           store the direction p and x + p. calculate the norm of p.
    		for(j = 0; j < N;++j) {
                wa1[j] = -wa1[j];
                wa2[j] = x[j] + wa1[j];
                wa3[j] = diag[j]*wa1[j];
    		}
			
    		pnorm = enorm(wa3,N);
    		//           on the first iteration, adjust the initial step bound.
    		if (iter == 1) {
    			delta = pmin(delta,pnorm);
    		}
    		//           evaluate the function at x + p and calculate its norm.

    		FUNCMULT_EVAL(funcmult,wa2,M,N,wa4);
    		*nfev = *nfev + 1;
    		fnorm1 = enorm(wa4,M);

    		//           compute the scaled actual reduction.

            actred = -one;
            if (p1*fnorm1 < fnorm) {
            	actred = one - (fnorm1/fnorm)*(fnorm1/fnorm);
            }

            //           compute the scaled predicted reduction and
            //           the scaled directional derivative.

            for(j = 0; j < N;++j) {
                wa3[j] = zero;
                l = ipvt[j];
                temp = wa1[l];
                for(i = 0;i <= j;++i) {
                	wa3[i] = wa3[i] + fjac[i*N+j]*temp;
                }
            }

            temp1 = enorm(wa3,N);
            temp1 = temp1/fnorm;
            temp2 = (sqrt(par)*pnorm)/fnorm;
            prered = temp1*temp1 + temp2*temp2/p5;
            dirder = -(temp1*temp1 + temp2*temp2);
            //           compute the ratio of the actual to the predicted
            //           reduction.
            ratio = zero;
            if (prered != zero) {
            	ratio = actred/prered;
            }
            //           update the step bound.
			

            if (ratio <= p25) {//240
            	if (actred >= zero) {
            		temp = p5;
            	}
            	if (actred < zero) {
            		temp = p5*dirder/(dirder + p5*actred);
            	}
            	if (p1*fnorm1 >= fnorm || temp < p1) {
            		temp = p1;
            	}
                delta = temp*pmin(delta,pnorm/p1);
                par = par/temp;
            } else if (par == zero || ratio >= p75){//240 - 260
                delta = pnorm/p5;
                par = p5*par;
            }//260

            //           test for successful iteration.

            if (ratio >= p0001) {//290
            	//           successful iteration. update x, fvec, and their norms.
            	for(j = 0; j < N;++j) {
                    x[j] = wa2[j];
                    wa2[j] = diag[j]*x[j];
            	}
            	for(i = 0; i < M;++i) {
            		fvec[i] = wa4[i];
            	}
                xnorm = enorm(wa2,N);
                fnorm = fnorm1;
                iter = iter + 1;
            }//290
            //           tests for convergence.
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one)) {
            	info = 1;
            }
            if (delta <= xtol*xnorm) {
            	info = 2;
            }
            if ((fabs(actred) <= ftol) && (prered <= ftol) && (p5*ratio <= one) && (info == 2)) {
            	info = 3;
            }
            if (info != 0) {
            	break;
            }

            //           tests for termination and stringent tolerances.
            if (*nfev >= maxfev) {
            	info = 5;
            }
            if ((fabs(actred) <= epsmch) && (prered <= epsmch) && (p5*ratio <= one)) {
            	info = 6;
            }
            if (delta <= epsmch*xnorm) {
            	info = 7;
            }
            if (gnorm <= epsmch) {
            	info = 8;
            }
            if (info != 0) {
            	break;
            }

    	}

        if (info != 0) {
        	break;
        }


    }


    free(wa1);
    free(wa2);
    free(wa3);
    free(wa4);

	return info;
}